

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

any __thiscall Json::init_right_of_pair(Json *this,string *s,size_t *start)

{
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  long lVar4;
  reference ppVar5;
  JsonException *this_00;
  size_t *in_RCX;
  _Storage extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage _Var6;
  any aVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  p;
  iterator __end5;
  iterator __begin5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *__range5;
  JsonTools j;
  double dStack_190;
  bool gotit;
  string local_188;
  Json local_168;
  string local_120 [32];
  size_t local_100;
  size_t end_1;
  string local_b0 [32];
  size_t local_90;
  size_t end;
  undefined1 local_58 [8];
  string str;
  size_t local_30;
  size_t i;
  size_t *start_local;
  string *s_local;
  Json *this_local;
  any *value;
  
  local_30 = *in_RCX;
  str.field_2._M_local_buf[0xf] = '\0';
  std::any::any((any *)this);
  std::__cxx11::string::string((string *)local_58);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)start);
  if (*pcVar3 == '\"') {
    JsonTools::parse_string_literally((string *)&end,(string *)start,*in_RCX + 1);
    std::__cxx11::string::operator=((string *)local_58,(string *)&end);
    std::__cxx11::string::~string((string *)&end);
    lVar4 = std::__cxx11::string::size();
    local_30 = lVar4 + 1 + local_30;
    std::any::operator=((any *)this,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)start);
    if (*pcVar3 == '[') {
      local_90 = JsonTools::size_of_item((string *)start,local_30,'[',']');
      std::__cxx11::string::substr((ulong)local_b0,(ulong)start);
      std::__cxx11::string::operator=((string *)local_58,local_b0);
      std::__cxx11::string::~string(local_b0);
      Json((Json *)&end_1,(string *)local_58);
      std::any::operator=((any *)this,(Json *)&end_1);
      ~Json((Json *)&end_1);
      local_30 = local_90 + local_30;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)start);
      if (*pcVar3 == '{') {
        local_100 = JsonTools::size_of_item((string *)start,local_30,'{','}');
        std::__cxx11::string::substr((ulong)local_120,(ulong)start);
        std::__cxx11::string::operator=((string *)local_58,local_120);
        std::__cxx11::string::~string(local_120);
        Json(&local_168,(string *)local_58);
        std::any::operator=((any *)this,&local_168);
        ~Json(&local_168);
        local_30 = local_100 + local_30;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)start);
        bVar1 = JsonTools::is_digit(*pcVar3);
        if (bVar1) {
          JsonTools::parse_number(&local_188,(string *)start,*in_RCX);
          std::__cxx11::string::operator=((string *)local_58,(string *)&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          lVar4 = std::__cxx11::string::size();
          local_30 = lVar4 + -1 + local_30;
          pcVar3 = (char *)std::__cxx11::string::c_str();
          dStack_190 = atof(pcVar3);
          std::any::operator=((any *)this,&stack0xfffffffffffffe70);
        }
        else {
          j.allowedLexems._M_h._M_single_bucket._7_1_ = 0;
          JsonTools::JsonTools((JsonTools *)&__range5);
          __end5 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                            *)&__range5);
          p.second._M_storage =
               (_Storage)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                      *)&__range5);
          while (bVar1 = std::__detail::operator!=
                                   (&__end5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_true>
                                    ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_true>
                                      *)&p.second._M_storage), bVar1) {
            ppVar5 = std::__detail::
                     _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_false,_true>
                     ::operator*(&__end5);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
            ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                    *)local_218,ppVar5);
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)&local_238,(ulong)start);
            _Var2 = std::operator==(&local_238,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_218);
            std::__cxx11::string::~string((string *)&local_238);
            if (_Var2) {
              lVar4 = std::__cxx11::string::length();
              local_30 = local_30 + lVar4;
              std::any::operator=((any *)this,(any *)((long)&p.first.field_2 + 8));
              j.allowedLexems._M_h._M_single_bucket._7_1_ = 1;
            }
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                     *)local_218);
            if (_Var2) break;
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_false,_true>
            ::operator++(&__end5);
          }
          if ((j.allowedLexems._M_h._M_single_bucket._7_1_ & 1) == 0) {
            this_00 = (JsonException *)__cxa_allocate_exception(0x10);
            json_exception::JsonException::JsonException(this_00,"Unexpected symbol!");
            __cxa_throw(this_00,&json_exception::JsonException::typeinfo,
                        json_exception::JsonException::~JsonException);
          }
          JsonTools::~JsonTools((JsonTools *)&__range5);
        }
      }
    }
  }
  *in_RCX = local_30;
  str.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_58);
  _Var6 = extraout_RDX;
  if ((str.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::any::~any((any *)this);
    _Var6 = extraout_RDX_00;
  }
  aVar7._M_storage._M_ptr = _Var6._M_ptr;
  aVar7._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar7;
}

Assistant:

any Json::init_right_of_pair(string& s, size_t& start) {
	size_t i = start;
	any value;
	string str;
	if (s[i] == '\"') {
		str = JsonTools::parse_string_literally(s, start + 1);
		i += str.size() + 1;
		value = str;
	} else if (s[i] == '[') {
		size_t end = JsonTools::size_of_item(s, i, '[', ']');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (s[i] == '{') {
		size_t end = JsonTools::size_of_item(s, i, '{', '}');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (JsonTools::is_digit(s[i])) {
		str = JsonTools::parse_number(s, start);
		i += str.size() - 1;
		value = atof(str.c_str());
	} else {
		bool gotit = false;
		JsonTools j;
		for (auto p : j.allowedLexems) {
			if (s.substr(i, p.first.length()) == p.first) {
				i += p.first.length();
				value = p.second;
				gotit = true;
				break;
			}
		}
		if (!gotit) throw json_exception::JsonException("Unexpected symbol!");
	}
	start = i;
	return value;
}